

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_refs.c
# Opt level: O2

RK_S32 mpp_hevc_frame_nb_refs(HEVCContext *s)

{
  ShortTermRPS *pSVar1;
  RK_S32 RVar2;
  RK_U8 *pRVar3;
  ulong uVar4;
  ulong uVar5;
  
  RVar2 = 0;
  if ((s->sh).slice_type != I_SLICE) {
    pSVar1 = (s->sh).short_term_rps;
    if (pSVar1 == (ShortTermRPS *)0x0) {
      RVar2 = 0;
    }
    else {
      uVar4 = (ulong)pSVar1->num_negative_pics;
      RVar2 = 0;
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        RVar2 = (RVar2 + 1) - (uint)(pSVar1->used[uVar5] == '\0');
      }
      pRVar3 = pSVar1->used + uVar4;
      for (; (int)uVar4 < pSVar1->num_delta_pocs; uVar4 = (ulong)((int)uVar4 + 1)) {
        RVar2 = (RVar2 + 1) - (uint)(*pRVar3 == '\0');
        pRVar3 = pRVar3 + 1;
      }
    }
    for (uVar4 = 0; (s->sh).long_term_rps.nb_refs != uVar4; uVar4 = uVar4 + 1) {
      RVar2 = (RVar2 + 1) - (uint)((s->sh).long_term_rps.used[uVar4] == '\0');
    }
  }
  return RVar2;
}

Assistant:

int mpp_hevc_frame_nb_refs(HEVCContext *s)
{
    RK_S32 ret = 0;
    RK_S32 i;
    const ShortTermRPS *rps = s->sh.short_term_rps;
    LongTermRPS *long_rps   = &s->sh.long_term_rps;

    if (s->sh.slice_type == I_SLICE) {
        return 0;
    }
    if (rps) {
        for (i = 0; (RK_U32)i < rps->num_negative_pics; i++)
            ret += !!rps->used[i];
        for (; i < rps->num_delta_pocs; i++)
            ret += !!rps->used[i];
    }

    if (long_rps) {
        for (i = 0; i < long_rps->nb_refs; i++)
            ret += !!long_rps->used[i];
    }
    return ret;
}